

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall
presolve::HPresolve::resetColImpliedBounds(HPresolve *this,HighsInt col,HighsInt row)

{
  int iVar1;
  HighsInt col_local;
  
  if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[col] == '\0') {
    iVar1 = (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[col];
    if ((iVar1 != -1) && (row == -1 || iVar1 == row)) {
      changeImplColLower(this,col,-INFINITY,-1);
    }
    iVar1 = (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[col];
    if ((iVar1 != -1) && (row == -1 || iVar1 == row)) {
      changeImplColUpper(this,col,INFINITY,-1);
      return;
    }
  }
  else if ((row != -1) &&
          ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start[row] == '\0')) {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              (&(this->colImplSourceByRow).
                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[row]._M_t,&col_local);
  }
  return;
}

Assistant:

void HPresolve::resetColImpliedBounds(HighsInt col, HighsInt row) {
  assert(row == -1 || colLowerSource[col] == row || colUpperSource[col] == row);
  if (!colDeleted[col]) {
    // set implied bounds to infinite values if (1) they were deduced from the
    // given row or (2) no row was given
    if (colLowerSource[col] != -1 && (row == -1 || colLowerSource[col] == row))
      changeImplColLower(col, -kHighsInf, -1);
    if (colUpperSource[col] != -1 && (row == -1 || colUpperSource[col] == row))
      changeImplColUpper(col, kHighsInf, -1);
  } else if (row != -1 && !rowDeleted[row]) {
    // remove column from row-wise implied bound storage
    colImplSourceByRow[row].erase(col);
  }
}